

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateOperandForDebugInfo
          (ValidationState_t *_,string *operand_name,Op expected_opcode,Instruction *inst,
          uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name)

{
  spv_result_t sVar1;
  Instruction *pIVar2;
  DiagnosticStream *pDVar3;
  spv_opcode_desc desc;
  spv_opcode_desc local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  DiagnosticStream local_208;
  
  pIVar2 = ValidationState_t::FindDef
                     (_,(inst->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[word_index]);
  sVar1 = SPV_SUCCESS;
  if ((pIVar2->inst_).opcode != expected_opcode) {
    local_230 = (spv_opcode_desc)0x0;
    sVar1 = AssemblyGrammar::lookupOpcode(&_->grammar_,expected_opcode,&local_230);
    if ((sVar1 == SPV_SUCCESS) && (local_230 != (spv_opcode_desc)0x0)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      if ((ext_inst_name->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001df1c5:
        std::__throw_bad_function_call();
      }
      (*ext_inst_name->_M_invoker)(&local_228,(_Any_data *)ext_inst_name);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"expected operand ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,(operand_name->_M_dataplus)._M_p,
                 operand_name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208," must be a result id of ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Op",2);
      pDVar3 = DiagnosticStream::operator<<(&local_208,&local_230->name);
      sVar1 = pDVar3->error_;
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      if ((ext_inst_name->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001df1c5;
      (*ext_inst_name->_M_invoker)(&local_228,(_Any_data *)ext_inst_name);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"expected operand ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,(operand_name->_M_dataplus)._M_p,
                 operand_name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208," is invalid",0xb);
      sVar1 = local_208.error_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  return sVar1;
}

Assistant:

spv_result_t ValidateOperandForDebugInfo(
    ValidationState_t& _, const std::string& operand_name,
    spv::Op expected_opcode, const Instruction* inst, uint32_t word_index,
    const std::function<std::string()>& ext_inst_name) {
  auto* operand = _.FindDef(inst->word(word_index));
  if (operand->opcode() != expected_opcode) {
    spv_opcode_desc desc = nullptr;
    if (_.grammar().lookupOpcode(expected_opcode, &desc) != SPV_SUCCESS ||
        !desc) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << ext_inst_name() << ": "
             << "expected operand " << operand_name << " is invalid";
    }
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << ext_inst_name() << ": "
           << "expected operand " << operand_name << " must be a result id of "
           << "Op" << desc->name;
  }
  return SPV_SUCCESS;
}